

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# client_data.cpp
# Opt level: O2

void __thiscall duckdb::ClientData::~ClientData(ClientData *this)

{
  ::std::__cxx11::string::~string((string *)&this->file_search_path);
  std::unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>::~unique_ptr
            (&(this->client_file_system).
              super_unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>_>);
  ::std::unique_ptr<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>_>::~unique_ptr
            (&(this->file_opener).
              super_unique_ptr<duckdb::FileOpener,_std::default_delete<duckdb::FileOpener>_>);
  ::std::unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>_>::
  ~unique_ptr(&(this->catalog_search_path).
               super_unique_ptr<duckdb::CatalogSearchPath,_std::default_delete<duckdb::CatalogSearchPath>_>
             );
  ::std::unique_ptr<duckdb::RandomEngine,_std::default_delete<duckdb::RandomEngine>_>::~unique_ptr
            (&(this->random_engine).
              super_unique_ptr<duckdb::RandomEngine,_std::default_delete<duckdb::RandomEngine>_>);
  ::std::unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>::
  ~unique_ptr(&(this->log_query_writer).
               super_unique_ptr<duckdb::BufferedFileWriter,_std::default_delete<duckdb::BufferedFileWriter>_>
             );
  ::std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<duckdb::PreparedStatementData,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&(this->prepared_statements)._M_h);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->temporary_objects).internal.
              super___shared_ptr<duckdb::AttachedDatabase,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->http_logger).internal.
              super___shared_ptr<duckdb::HTTPLogger,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&(this->profiler).internal.
              super___shared_ptr<duckdb::QueryProfiler,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

ClientData::~ClientData() {
}